

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultipleShootingSolver.cpp
# Opt level: O3

bool __thiscall
iDynTree::optimalcontrol::MultipleShootingSolver::MultipleShootingTranscription::getTimings
          (MultipleShootingTranscription *this,
          vector<double,_std::allocator<double>_> *stateEvaluations,
          vector<double,_std::allocator<double>_> *controlEvaluations)

{
  bool bVar1;
  pointer paVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer paVar5;
  size_type __new_size;
  long lVar6;
  long lVar7;
  MeshPointOrigin first;
  MeshPointOrigin ignored;
  long *local_b0;
  long local_a0 [2];
  long *local_90;
  long local_80 [2];
  int local_70;
  long *local_68;
  long local_58 [2];
  long *local_48;
  long local_38 [3];
  
  bVar1 = this->m_prepared;
  if (bVar1 == false) {
    iDynTree::reportWarning
              ("MultipleShootingTranscription","getTimings",
               "The method solve was not called yet. Use the method getPossibleTimings instead.");
  }
  else {
    __new_size = this->m_totalMeshes - 1;
    if ((long)(stateEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(stateEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != __new_size) {
      std::vector<double,_std::allocator<double>_>::resize(stateEvaluations,__new_size);
    }
    if ((long)(controlEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(controlEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 != this->m_controlMeshes) {
      std::vector<double,_std::allocator<double>_>::resize(controlEvaluations,this->m_controlMeshes)
      ;
    }
    MeshPointOrigin::FirstPoint();
    MeshPointOrigin::Ignored();
    paVar5 = (this->m_meshPoints).
             super__Vector_base<iDynTree::optimalcontrol::MeshPoint,_std::allocator<iDynTree::optimalcontrol::MeshPoint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    paVar2 = (this->m_meshPointsEnd)._M_current;
    if (paVar5 != paVar2) {
      pdVar3 = (stateEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (controlEvaluations->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      lVar7 = 0;
      do {
        if ((paVar5->origin).m_priority != local_70) {
          pdVar3[lVar7] = paVar5->time;
          lVar7 = lVar7 + 1;
        }
        if (paVar5->type == Control) {
          pdVar4[lVar6] = paVar5->time;
          lVar6 = lVar6 + 1;
        }
        paVar5 = paVar5 + 1;
      } while (paVar5 != paVar2);
    }
    if (local_48 != local_38) {
      operator_delete(local_48,local_38[0] + 1);
    }
    if (local_68 != local_58) {
      operator_delete(local_68,local_58[0] + 1);
    }
    if (local_90 != local_80) {
      operator_delete(local_90,local_80[0] + 1);
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0,local_a0[0] + 1);
    }
  }
  return bVar1;
}

Assistant:

bool getTimings(std::vector<double>& stateEvaluations, std::vector<double>& controlEvaluations) {
                if (!(m_prepared)){
                    reportWarning("MultipleShootingTranscription", "getTimings", "The method solve was not called yet. Use the method getPossibleTimings instead.");

                    return false;
                }

                if (stateEvaluations.size() != (m_totalMeshes - 1)) {
                    stateEvaluations.resize(m_totalMeshes - 1);
                }

                if (controlEvaluations.size() != m_controlMeshes) {
                    controlEvaluations.resize(m_controlMeshes);
                }

                size_t stateIndex = 0, controlIndex = 0;

                MeshPointOrigin first = MeshPointOrigin::FirstPoint();
                MeshPointOrigin ignored = MeshPointOrigin::Ignored();

                for (auto mesh = m_meshPoints.begin(); mesh != m_meshPointsEnd; ++mesh){

                    assert(mesh->origin != ignored);

                    if (mesh->origin != first){
                        stateEvaluations[stateIndex] = mesh->time;
                        stateIndex++;
                    }
                    if (mesh->type == MeshPointType::Control){
                        controlEvaluations[controlIndex] = mesh->time;
                        controlIndex++;
                    }
                }

                return true;
            }